

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManAreaFlow(Of_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Of_Obj_t *pOVar3;
  Gia_Man_t *pGVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  bool bVar10;
  
  if (p->pGia->pRefs != (int *)0x0) {
    __assert_fail("p->pGia->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0xaf,"void Of_ManAreaFlow(Of_Man_t *)");
  }
  Gia_ManCreateRefs(p->pGia);
  pOVar3 = p->pObjs;
  pOVar3->Flow = 0;
  pGVar4 = p->pGia;
  lVar7 = (long)pGVar4->vCis->nSize;
  if (0 < lVar7) {
    piVar5 = pGVar4->vCis->pArray;
    lVar8 = 0;
    do {
      iVar1 = piVar5[lVar8];
      if (((long)iVar1 < 0) || (pGVar4->nObjs <= iVar1)) goto LAB_00734bf7;
      if (iVar1 == 0) break;
      pOVar3[iVar1].Flow = 0;
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  uVar2 = pGVar4->nObjs;
  if ((0 < (int)uVar2) && (pGVar4->pObjs != (Gia_Obj_t *)0x0)) {
    puVar9 = &pGVar4->pObjs->Value;
    lVar7 = 0;
    do {
      uVar6 = *(ulong *)(puVar9 + -2);
      if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
        (&pOVar3->Flow)[lVar7 * 2] =
             (*(int *)((long)puVar9 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3) +
              *(int *)((long)puVar9 + (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3) + 1000U) /
             *(uint *)((long)pGVar4->pRefs + lVar7);
      }
      puVar9 = puVar9 + 3;
      lVar7 = lVar7 + 4;
    } while ((ulong)uVar2 * 4 - lVar7 != 0);
  }
  lVar7 = (long)pGVar4->vCos->nSize;
  if (0 < lVar7) {
    lVar8 = 0;
    do {
      iVar1 = pGVar4->vCos->pArray[lVar8];
      if ((iVar1 < 0) || ((int)uVar2 <= iVar1)) {
LAB_00734bf7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
    } while ((pGVar4->pObjs != (Gia_Obj_t *)0x0) &&
            (bVar10 = lVar7 + -1 != lVar8, lVar8 = lVar8 + 1, bVar10));
  }
  if (pGVar4->pRefs != (int *)0x0) {
    free(pGVar4->pRefs);
    p->pGia->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Of_ManAreaFlow( Of_Man_t * p )
{
    int AreaUnit = 1000;
    int i, Id, Total = 0;
    Gia_Obj_t * pObj;
    assert( p->pGia->pRefs == NULL );
    Gia_ManCreateRefs( p->pGia );
    Of_ObjSetFlow( p, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Of_ObjSetFlow( p, Id, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, Id )
        Of_ObjSetFlow( p, Id, (Gia_ObjFanin0(pObj)->Value + Gia_ObjFanin1(pObj)->Value + AreaUnit) / Gia_ObjRefNum(p->pGia, pObj) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Total += Gia_ObjFanin0(pObj)->Value;
    ABC_FREE( p->pGia->pRefs );
    if ( 1 )
        return;
    printf( "CI = %5d.  ", Gia_ManCiNum(p->pGia) );
    printf( "CO = %5d.  ", Gia_ManCoNum(p->pGia) );
    printf( "And = %8d.  ", Gia_ManAndNum(p->pGia) );
    printf( "Area = %8d.  ", Total/AreaUnit );
    printf( "\n" );
}